

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

double __thiscall base_uint<256U>::getdouble(base_uint<256U> *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  double fact;
  double ret;
  undefined4 local_24;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0.0;
  local_20 = 1.0;
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    local_18 = local_20 * (double)*(uint *)(in_RDI + (long)local_24 * 4) + local_18;
    local_20 = local_20 * 4294967296.0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

double base_uint<BITS>::getdouble() const
{
    double ret = 0.0;
    double fact = 1.0;
    for (int i = 0; i < WIDTH; i++) {
        ret += fact * pn[i];
        fact *= 4294967296.0;
    }
    return ret;
}